

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::
vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>_>
::push_back(vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>_>
            *this,_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>
                  *obj)

{
  _Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>
  *in_RSI;
  vector<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>_>
  *in_RDI;
  bool bVar1;
  undefined2 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffda;
  undefined1 in_stack_ffffffffffffffdb;
  uint32_t in_stack_ffffffffffffffdc;
  
  bVar1 = true;
  if ((in_RDI->m_p !=
       (_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>
        *)0x0) && (bVar1 = true, in_RDI->m_p <= in_RSI)) {
    bVar1 = in_RDI->m_p + in_RDI->m_size <= in_RSI;
  }
  if (!bVar1) {
    __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x267,
                  "void basisu::vector<std::__detail::_Node_const_iterator<std::pair<const basisu::vec<6, float>, basisu::weighted_block_group>, false, true>>::push_back(const T &) [T = std::__detail::_Node_const_iterator<std::pair<const basisu::vec<6, float>, basisu::weighted_block_group>, false, true>]"
                 );
  }
  if (in_RDI->m_capacity <= in_RDI->m_size) {
    increase_capacity(in_RDI,in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb,
                      (bool)in_stack_ffffffffffffffda);
  }
  scalar_type<std::__detail::_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>_>
  ::construct((_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>
               *)in_RDI,
              (_Node_const_iterator<std::pair<const_basisu::vec<6U,_float>,_basisu::weighted_block_group>,_false,_true>
               *)CONCAT44(in_stack_ffffffffffffffdc,
                          CONCAT13(in_stack_ffffffffffffffdb,
                                   CONCAT12(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8))));
  in_RDI->m_size = in_RDI->m_size + 1;
  return;
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }